

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O3

TypeDescriptor * andOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  NumberDescriptor *this;
  double value;
  
  this = (NumberDescriptor *)operator_new(0x60);
  if ((leftValue->_number != 1.0) || (NAN(leftValue->_number))) {
    value = 0.0;
  }
  else {
    value = (double)(-(ulong)(rightValue->_number == 1.0) & 0x3ff0000000000000);
  }
  NumberDescriptor::NumberDescriptor(this,value);
  return &this->super_TypeDescriptor;
}

Assistant:

TypeDescriptor *andOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
       && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numEqual = new NumberDescriptor(leftValue->getNumber() == 1.0 && rightValue->getNumber() == 1.0);
        return numEqual;
    }
}